

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O0

int determine_disflow_correspondence
              (ImagePyramid *src_pyr,ImagePyramid *ref_pyr,CornerList *corners,FlowField *flow,
              Correspondence *correspondences)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int patch_tl_y;
  int patch_tl_x;
  double flow_v;
  double flow_u;
  double v_kernel [4];
  double h_kernel [4];
  double flow_sub_y;
  int flow_y;
  double flow_sub_x;
  int flow_x;
  int y;
  int x;
  int y0;
  int x0;
  int i;
  int num_correspondences;
  int stride;
  int height;
  int width;
  double local_c8;
  double local_c0;
  double *in_stack_ffffffffffffff48;
  double *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  double *in_stack_ffffffffffffff60;
  double local_98 [5];
  double local_70;
  int local_64;
  double local_60;
  int local_58;
  uint local_54;
  uint local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  undefined4 local_3c;
  int local_38;
  int local_34;
  long local_30;
  long local_20;
  long local_18;
  long local_10;
  
  local_34 = *(int *)(in_RCX + 0x18);
  local_38 = *(int *)(in_RCX + 0x1c);
  local_3c = *(undefined4 *)(in_RCX + 0x20);
  local_40 = 0;
  local_30 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  for (local_44 = 0; local_44 < *(int *)(local_20 + 0x2c); local_44 = local_44 + 1) {
    local_48 = *(int *)(local_20 + 0x30 + (long)(local_44 << 1) * 4);
    local_4c = *(int *)(local_20 + 0x30 + (long)(local_44 * 2 + 1) * 4);
    local_50 = local_48 - 3;
    local_54 = local_4c - 3;
    local_58 = (int)local_50 >> 3;
    local_60 = (double)(local_50 & 7) / 8.0;
    local_64 = (int)local_54 >> 3;
    local_70 = (double)(local_54 & 7) / 8.0;
    if ((((0 < local_58) && (local_58 + 2 < local_34)) && (0 < local_64)) &&
       (local_64 + 2 < local_38)) {
      get_cubic_kernel_dbl(local_60,local_98);
      get_cubic_kernel_dbl(local_70,(double *)&stack0xffffffffffffff48);
      local_c0 = bicubic_interp_one(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                                    in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      local_c8 = bicubic_interp_one(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                                    in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      (*aom_compute_flow_at_point)
                ((uint8_t *)**(undefined8 **)(local_10 + 0x38),
                 (uint8_t *)**(undefined8 **)(local_18 + 0x38),local_48 + -3,local_4c + -3,
                 *(int *)(*(long *)(local_10 + 0x38) + 8),*(int *)(*(long *)(local_10 + 0x38) + 0xc)
                 ,*(int *)(*(long *)(local_10 + 0x38) + 0x10),&local_c0,&local_c8);
      *(double *)(local_30 + (long)local_40 * 0x20) = (double)local_48;
      *(double *)(local_30 + (long)local_40 * 0x20 + 8) = (double)local_4c;
      *(double *)(local_30 + (long)local_40 * 0x20 + 0x10) = (double)local_48 + local_c0;
      *(double *)(local_30 + (long)local_40 * 0x20 + 0x18) = (double)local_4c + local_c8;
      local_40 = local_40 + 1;
    }
  }
  return local_40;
}

Assistant:

static int determine_disflow_correspondence(const ImagePyramid *src_pyr,
                                            const ImagePyramid *ref_pyr,
                                            CornerList *corners,
                                            const FlowField *flow,
                                            Correspondence *correspondences) {
  const int width = flow->width;
  const int height = flow->height;
  const int stride = flow->stride;

  int num_correspondences = 0;
  for (int i = 0; i < corners->num_corners; ++i) {
    const int x0 = corners->corners[2 * i];
    const int y0 = corners->corners[2 * i + 1];

    // Offset points, to compensate for the fact that (say) a flow field entry
    // at horizontal index i, is nominally associated with the pixel at
    // horizontal coordinate (i << DOWNSAMPLE_FACTOR) + UPSAMPLE_CENTER_OFFSET
    // This offset must be applied before we split the coordinate into integer
    // and fractional parts, in order for the interpolation to be correct.
    const int x = x0 - UPSAMPLE_CENTER_OFFSET;
    const int y = y0 - UPSAMPLE_CENTER_OFFSET;

    // Split the pixel coordinates into integer flow field coordinates and
    // an offset for interpolation
    const int flow_x = x >> DOWNSAMPLE_SHIFT;
    const double flow_sub_x =
        (x & (DOWNSAMPLE_FACTOR - 1)) / (double)DOWNSAMPLE_FACTOR;
    const int flow_y = y >> DOWNSAMPLE_SHIFT;
    const double flow_sub_y =
        (y & (DOWNSAMPLE_FACTOR - 1)) / (double)DOWNSAMPLE_FACTOR;

    // Exclude points which would sample from the outer border of the flow
    // field, as this would give lower-quality results.
    //
    // Note: As we never read from the border region at pyramid level 0, we
    // can skip filling it in. If the conditions here are removed, or any
    // other logic is added which reads from this border region, then
    // compute_flow_field() will need to be modified to call
    // fill_flow_field_borders() at pyramid level 0 to set up the correct
    // border data.
    if (flow_x < 1 || (flow_x + 2) >= width) continue;
    if (flow_y < 1 || (flow_y + 2) >= height) continue;

    double h_kernel[4];
    double v_kernel[4];
    get_cubic_kernel_dbl(flow_sub_x, h_kernel);
    get_cubic_kernel_dbl(flow_sub_y, v_kernel);

    double flow_u = bicubic_interp_one(&flow->u[flow_y * stride + flow_x],
                                       stride, h_kernel, v_kernel);
    double flow_v = bicubic_interp_one(&flow->v[flow_y * stride + flow_x],
                                       stride, h_kernel, v_kernel);

    // Refine the interpolated flow vector one last time
    const int patch_tl_x = x0 - DISFLOW_PATCH_CENTER;
    const int patch_tl_y = y0 - DISFLOW_PATCH_CENTER;
    aom_compute_flow_at_point(
        src_pyr->layers[0].buffer, ref_pyr->layers[0].buffer, patch_tl_x,
        patch_tl_y, src_pyr->layers[0].width, src_pyr->layers[0].height,
        src_pyr->layers[0].stride, &flow_u, &flow_v);

    // Use original points (without offsets) when filling in correspondence
    // array
    correspondences[num_correspondences].x = x0;
    correspondences[num_correspondences].y = y0;
    correspondences[num_correspondences].rx = x0 + flow_u;
    correspondences[num_correspondences].ry = y0 + flow_v;
    num_correspondences++;
  }
  return num_correspondences;
}